

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agentf.c
# Opt level: O3

void agentf_callback(void *vctx,void *reply,int replylen)

{
  char *pcVar1;
  long lVar2;
  
  *(undefined8 *)((long)vctx + 0x30) = 0;
  pcVar1 = "";
  if (reply != (void *)0x0) {
    pcVar1 = (char *)reply;
  }
  lVar2 = 5;
  if (reply != (void *)0x0) {
    lVar2 = (long)replylen;
  }
  (**(code **)**vctx)(*vctx,0,pcVar1,lVar2);
  safefree(reply);
  agentf_try_forward((agentf *)vctx);
  return;
}

Assistant:

static void agentf_callback(void *vctx, void *reply, int replylen)
{
    agentf *af = (agentf *)vctx;

    agentf_got_response(af, reply, replylen);
    sfree(reply);

    /*
     * Now try to extract and send further messages from the channel's
     * input-side buffer.
     */
    agentf_try_forward(af);
}